

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

lu_mem singlestep(lua_State *L)

{
  global_State *g_00;
  GCObject *o;
  int iVar1;
  GCObject **nextlist;
  global_State *g;
  lu_mem lVar2;
  
  g_00 = L->l_G;
  g_00->gcstopem = '\x01';
  lVar2 = 0;
  switch(g_00->gcstate) {
  case '\0':
    if (g_00->gray == (GCObject *)0x0) {
      g_00->gcstate = '\x01';
      goto LAB_001270d1;
    }
    lVar2 = propagatemark(g_00);
    break;
  case '\x01':
    lVar2 = atomic(L);
    entersweep(L);
    g_00->GCestimate = g_00->GCdebt + g_00->totalbytes;
    break;
  default:
    goto switchD_00126fc6_caseD_2;
  case '\x03':
    nextlist = &g_00->finobj;
    iVar1 = 4;
    goto LAB_001270c3;
  case '\x04':
    nextlist = &g_00->tobefnz;
    iVar1 = 5;
    goto LAB_001270c3;
  case '\x05':
    iVar1 = 6;
    nextlist = (GCObject **)0x0;
LAB_001270c3:
    iVar1 = sweepstep(L,g_00,iVar1,nextlist);
    lVar2 = (lu_mem)iVar1;
    break;
  case '\x06':
    checkSizes(L,g_00);
    g_00->gcstate = '\a';
LAB_001270d1:
    lVar2 = 0;
    break;
  case '\a':
    if ((g_00->tobefnz == (GCObject *)0x0) || (g_00->gcemergency != '\0')) {
      g_00->gcstate = '\b';
      goto LAB_001270d1;
    }
    g_00->gcstopem = '\0';
    lVar2 = 0;
    while (((int)lVar2 != 500 && (g_00->tobefnz != (GCObject *)0x0))) {
      GCTM(L);
      lVar2 = lVar2 + 0x32;
    }
    break;
  case '\b':
    g_00->weak = (GCObject *)0x0;
    g_00->ephemeron = (GCObject *)0x0;
    g_00->allweak = (GCObject *)0x0;
    g_00->gray = (GCObject *)0x0;
    g_00->grayagain = (GCObject *)0x0;
    if ((g_00->mainthread->marked & 0x18) != 0) {
      reallymarkobject(g_00,(GCObject *)g_00->mainthread);
    }
    if ((((g_00->l_registry).tt_ & 0x40) != 0) &&
       (o = (g_00->l_registry).value_.gc, (o->marked & 0x18) != 0)) {
      reallymarkobject(g_00,o);
    }
    markmt(g_00);
    markbeingfnz(g_00);
    g_00->gcstate = '\0';
    lVar2 = 1;
  }
  g_00->gcstopem = '\0';
switchD_00126fc6_caseD_2:
  return lVar2;
}

Assistant:

static lu_mem singlestep (lua_State *L) {
  global_State *g = G(L);
  lu_mem work;
  lua_assert(!g->gcstopem);  /* collector is not reentrant */
  g->gcstopem = 1;  /* no emergency collections while collecting */
  switch (g->gcstate) {
    case GCSpause: {
      restartcollection(g);
      g->gcstate = GCSpropagate;
      work = 1;
      break;
    }
    case GCSpropagate: {
      if (g->gray == NULL) {  /* no more gray objects? */
        g->gcstate = GCSenteratomic;  /* finish propagate phase */
        work = 0;
      }
      else
        work = propagatemark(g);  /* traverse one gray object */
      break;
    }
    case GCSenteratomic: {
      work = atomic(L);  /* work is what was traversed by 'atomic' */
      entersweep(L);
      g->GCestimate = gettotalbytes(g);  /* first estimate */;
      break;
    }
    case GCSswpallgc: {  /* sweep "regular" objects */
      work = sweepstep(L, g, GCSswpfinobj, &g->finobj);
      break;
    }
    case GCSswpfinobj: {  /* sweep objects with finalizers */
      work = sweepstep(L, g, GCSswptobefnz, &g->tobefnz);
      break;
    }
    case GCSswptobefnz: {  /* sweep objects to be finalized */
      work = sweepstep(L, g, GCSswpend, NULL);
      break;
    }
    case GCSswpend: {  /* finish sweeps */
      checkSizes(L, g);
      g->gcstate = GCScallfin;
      work = 0;
      break;
    }
    case GCScallfin: {  /* call remaining finalizers */
      if (g->tobefnz && !g->gcemergency) {
        g->gcstopem = 0;  /* ok collections during finalizers */
        work = runafewfinalizers(L, GCFINMAX) * GCFINALIZECOST;
      }
      else {  /* emergency mode or no more finalizers */
        g->gcstate = GCSpause;  /* finish collection */
        work = 0;
      }
      break;
    }
    default: lua_assert(0); return 0;
  }
  g->gcstopem = 0;
  return work;
}